

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

void polyscope::view::setViewFromJson(string *jsonData,bool flyTo)

{
  bool bVar1;
  __type _Var2;
  int height;
  reference pvVar3;
  size_type sVar4;
  reference this;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *paVar5;
  ProjectionMode mode;
  ProjectionMode mode_00;
  int i;
  int iVar6;
  int j_1;
  long lVar7;
  undefined4 uVar8;
  long lVar9;
  float fVar10;
  allocator local_339;
  json j;
  int local_324;
  double local_320;
  double local_318;
  string projectionModeStr;
  double local_2f0;
  value_type matData;
  string local_2d8;
  key_type local_2b8;
  key_type local_298;
  key_type local_278;
  key_type local_258;
  key_type local_238;
  mat4 newViewMat;
  iterator it;
  stringstream s;
  
  height = windowHeight;
  local_324 = windowWidth;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&j,(nullptr_t)0x0);
  std::__cxx11::stringstream::stringstream((stringstream *)&s,(string *)jsonData,_S_out|_S_in);
  nlohmann::operator>>((istream *)&s,&j);
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&j,"viewMat");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&matData,pvVar3);
  sVar4 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::size(&matData);
  if (sVar4 != 0x10) {
    local_318 = -777.0;
    local_2f0 = -777.0;
    local_320 = -777.0;
    goto LAB_001d1f03;
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin(&it,&matData);
  for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
    lVar7 = 0;
    for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 0x10) {
      this = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator*(&it);
      fVar10 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::get<float,_float,_0>(this);
      if (iVar6 == 1) {
        paVar5 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
                 &newViewMat.value[lVar7].field_1;
      }
      else if (iVar6 == 2) {
        paVar5 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
                 &newViewMat.value[lVar7].field_2;
      }
      else if (iVar6 == 3) {
        paVar5 = &newViewMat.value[lVar7].field_3;
      }
      else {
        paVar5 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
                 ((long)&newViewMat.value[0].field_0 + lVar9);
      }
      paVar5->w = fVar10;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++(&it);
      lVar7 = lVar7 + 1;
    }
  }
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&j,"fov");
  local_2f0 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::get<double,_double,_0>(pvVar3);
  std::__cxx11::string::string((string *)&local_238,"nearClipRatio",&local_339);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::find((iterator *)&projectionModeStr,&j,&local_238);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((iterator *)&local_2d8,&j);
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&projectionModeStr,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_238);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&j,"nearClipRatio");
    local_318 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::get<double,_double,_0>(pvVar3);
  }
  else {
    local_318 = -777.0;
  }
  std::__cxx11::string::string((string *)&local_258,"farClipRatio",&local_339);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::find((iterator *)&projectionModeStr,&j,&local_258);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((iterator *)&local_2d8,&j);
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&projectionModeStr,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_258);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&j,"farClipRatio");
    local_320 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::get<double,_double,_0>(pvVar3);
  }
  else {
    local_320 = -777.0;
  }
  std::__cxx11::string::string((string *)&local_278,"windowWidth",&local_339);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::find((iterator *)&projectionModeStr,&j,&local_278);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((iterator *)&local_2d8,&j);
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&projectionModeStr,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_278);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&j,"windowWidth");
    local_324 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::get<int,_int,_0>(pvVar3);
  }
  std::__cxx11::string::string((string *)&local_298,"windowHeight",&local_339);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::find((iterator *)&projectionModeStr,&j,&local_298);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((iterator *)&local_2d8,&j);
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&projectionModeStr,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_298);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&j,"windowHeight");
    height = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::get<int,_int,_0>(pvVar3);
  }
  std::__cxx11::string::string((string *)&local_2b8,"projectionMode",&local_339);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::find((iterator *)&projectionModeStr,&j,&local_2b8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((iterator *)&local_2d8,&j);
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&projectionModeStr,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  if (!bVar1) goto LAB_001d1f03;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&j,"projectionMode");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&projectionModeStr,pvVar3);
  uVar8 = 0;
  to_string_abi_cxx11_(&local_2d8,(view *)0x0,mode);
  _Var2 = std::operator==(&projectionModeStr,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  if (_Var2) {
LAB_001d1eeb:
    projectionMode = uVar8;
  }
  else {
    uVar8 = 1;
    to_string_abi_cxx11_(&local_2d8,(view *)0x1,mode_00);
    _Var2 = std::operator==(&projectionModeStr,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    if (_Var2) goto LAB_001d1eeb;
  }
  std::__cxx11::string::~string((string *)&projectionModeStr);
LAB_001d1f03:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&matData);
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&j);
  if (sVar4 == 0x10) {
    setWindowSize(local_324,height);
    if (0.0 < local_318) {
      nearClipRatio = local_318;
    }
    if (0.0 < local_320) {
      farClipRatio = local_320;
    }
    if (flyTo) {
      startFlightTo(&newViewMat,(float)fov,0.4);
    }
    else {
      viewMat = newViewMat.value[0].field_0;
      viewMat_4 = newViewMat.value[0].field_1;
      DAT_0059f6dc = newViewMat.value[0].field_2;
      _DAT_0059f6e0 = newViewMat.value[0].field_3;
      uRam000000000059f6e4._0_4_ = newViewMat.value[1].field_0;
      DAT_0059f6e8 = newViewMat.value[1].field_1;
      DAT_0059f6ec = newViewMat.value[1].field_2;
      DAT_0059f6f0 = newViewMat.value[1].field_3;
      uRam000000000059f6f4._0_4_ = newViewMat.value[2].field_0;
      uRam000000000059f6f4._4_4_ = newViewMat.value[2].field_1;
      DAT_0059f6fc = newViewMat.value[2].field_2;
      _DAT_0059f700 = newViewMat.value[2].field_3;
      uRam000000000059f704._0_4_ = newViewMat.value[3].field_0;
      uRam000000000059f704._4_4_ = newViewMat.value[3].field_1;
      uRam000000000059f70c._0_4_ = newViewMat.value[3].field_2;
      DAT_0059f710 = newViewMat.value[3].field_3;
      fov = local_2f0;
      requestRedraw();
    }
  }
  return;
}

Assistant:

void setViewFromJson(std::string jsonData, bool flyTo) {
  // Values will go here
  glm::mat4 newViewMat;
  double newFov = -777;
  double newNearClipRatio = -777;
  double newFarClipRatio = -777;

  int windowWidth = view::windowWidth;
  int windowHeight = view::windowHeight;

  try {

    // Deserialize
    json j;
    std::stringstream s(jsonData);
    s >> j;

    // Read out the data
    auto matData = j["viewMat"];
    if (matData.size() != 16) return; // check size
    auto it = matData.begin();
    for (int i = 0; i < 4; i++) {
      for (int j = 0; j < 4; j++) {
        newViewMat[j][i] = *it;
        it++;
      }
    }
    newFov = j["fov"];

    // Get the clip ratios, but only if present
    if (j.find("nearClipRatio") != j.end()) {
      newNearClipRatio = j["nearClipRatio"];
    }
    if (j.find("farClipRatio") != j.end()) {
      newFarClipRatio = j["farClipRatio"];
    }

    // Get the window sizes, if present
    if (j.find("windowWidth") != j.end()) {
      windowWidth = j["windowWidth"];
    }
    if (j.find("windowHeight") != j.end()) {
      windowHeight = j["windowHeight"];
    }

    if (j.find("projectionMode") != j.end()) {
      std::string projectionModeStr = j["projectionMode"];
      if (projectionModeStr == to_string(ProjectionMode::Perspective)) {
        view::projectionMode = ProjectionMode::Perspective;
      } else if (projectionModeStr == to_string(ProjectionMode::Orthographic)) {
        view::projectionMode = ProjectionMode::Orthographic;
      }
    }

  } catch (...) {
    // If anything goes wrong parsing, just give up
    return;
  }

  // === Assign the new values

  view::setWindowSize(windowWidth, windowHeight);

  if (newNearClipRatio > 0) nearClipRatio = newNearClipRatio;
  if (newFarClipRatio > 0) farClipRatio = newFarClipRatio;

  if (flyTo) {
    startFlightTo(newViewMat, fov);
  } else {
    viewMat = newViewMat;
    fov = newFov;
    requestRedraw();
  }
}